

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_sse2.cpp
# Opt level: O1

void memfill32(uint32_t *dest,uint32_t value,int length)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint32_t *puVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  if (((ulong)dest & 0xf) != 0 && length != 0) {
    puVar5 = dest + 1;
    uVar8 = length;
    do {
      *dest = value;
      dest = dest + 1;
      length = uVar8 - 1;
      if (uVar8 == 1) break;
      uVar7 = (ulong)puVar5 & 0xf;
      puVar5 = puVar5 + 1;
      uVar8 = length;
    } while (uVar7 != 0);
  }
  uVar8 = length;
  if (0x1f < length) {
    do {
      *dest = value;
      dest[1] = value;
      dest[2] = value;
      dest[3] = value;
      dest[4] = value;
      dest[5] = value;
      dest[6] = value;
      dest[7] = value;
      dest[8] = value;
      dest[9] = value;
      dest[10] = value;
      dest[0xb] = value;
      dest[0xc] = value;
      dest[0xd] = value;
      dest[0xe] = value;
      dest[0xf] = value;
      dest[0x10] = value;
      dest[0x11] = value;
      dest[0x12] = value;
      dest[0x13] = value;
      dest[0x14] = value;
      dest[0x15] = value;
      dest[0x16] = value;
      dest[0x17] = value;
      dest[0x18] = value;
      dest[0x19] = value;
      dest[0x1a] = value;
      dest[0x1b] = value;
      dest[0x1c] = value;
      dest[0x1d] = value;
      dest[0x1e] = value;
      dest[0x1f] = value;
      dest = dest + 0x20;
      length = uVar8 - 0x20;
      bVar1 = 0x3f < (int)uVar8;
      uVar8 = length;
    } while (bVar1);
  }
  if (0xf < length) {
    *dest = value;
    dest[1] = value;
    dest[2] = value;
    dest[3] = value;
    dest[4] = value;
    dest[5] = value;
    dest[6] = value;
    dest[7] = value;
    dest[8] = value;
    dest[9] = value;
    dest[10] = value;
    dest[0xb] = value;
    dest[0xc] = value;
    dest[0xd] = value;
    dest[0xe] = value;
    dest[0xf] = value;
    dest = dest + 0x10;
    length = length - 0x10;
  }
  if (7 < length) {
    *dest = value;
    dest[1] = value;
    dest[2] = value;
    dest[3] = value;
    dest[4] = value;
    dest[5] = value;
    dest[6] = value;
    dest[7] = value;
    dest = dest + 8;
    length = length - 8;
  }
  if (3 < length) {
    *dest = value;
    dest[1] = value;
    dest[2] = value;
    dest[3] = value;
    dest = dest + 4;
    length = length - 4;
  }
  auVar4 = _DAT_00141150;
  auVar3 = _DAT_00141140;
  auVar2 = _DAT_001410e0;
  if (length != 0) {
    lVar6 = (ulong)(uint)length - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_001410e0;
    do {
      auVar11._8_4_ = (int)uVar7;
      auVar11._0_8_ = uVar7;
      auVar11._12_4_ = (int)(uVar7 >> 0x20);
      auVar12 = (auVar11 | auVar4) ^ auVar2;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        dest[uVar7] = value;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        dest[uVar7 + 1] = value;
      }
      auVar11 = (auVar11 | auVar3) ^ auVar2;
      iVar13 = auVar11._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
        dest[uVar7 + 2] = value;
        dest[uVar7 + 3] = value;
      }
      uVar7 = uVar7 + 4;
    } while (((ulong)(uint)length + 3 & 0xfffffffffffffffc) != uVar7);
  }
  return;
}

Assistant:

void memfill32(uint32_t* dest, uint32_t value, int length)
{
    __m128i vector_data = _mm_set_epi32(value, value, value, value);

    // run till memory alligned to 16byte memory
    while (length && ((uintptr_t)dest & 0xf)) {
        *dest++ = value;
        length--;
    }

    while (length >= 32) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);
        _mm_store_si128((__m128i*)(dest + 16), vector_data);
        _mm_store_si128((__m128i*)(dest + 20), vector_data);
        _mm_store_si128((__m128i*)(dest + 24), vector_data);
        _mm_store_si128((__m128i*)(dest + 28), vector_data);

        dest += 32;
        length -= 32;
    }

    if (length >= 16) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);

        dest += 16;
        length -= 16;
    }

    if (length >= 8) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);

        dest += 8;
        length -= 8;
    }

    if (length >= 4) {
        _mm_store_si128((__m128i*)(dest), vector_data);

        dest += 4;
        length -= 4;
    }

    while (length) {
        *dest++ = value;
        length--;
    }
}